

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

cio_error cio_timer_init(cio_timer *timer,cio_eventloop *loop,cio_timer_close_hook_t close_hook)

{
  cio_timer_impl *evn;
  int __fd;
  cio_error cVar1;
  int *piVar2;
  
  __fd = timerfd_create(1,0x800);
  if (__fd == -1) {
    piVar2 = __errno_location();
    cVar1 = -*piVar2;
  }
  else {
    timer->close_hook = close_hook;
    evn = &timer->impl;
    timer->handler = (cio_timer_handler_t)0x0;
    timer->handler_context = (void *)0x0;
    (timer->impl).loop = loop;
    (timer->impl).ev.read_callback = timer_read;
    (timer->impl).ev.write_callback = (_func_void_void_ptr_cio_epoll_error *)0x0;
    (timer->impl).ev.fd = __fd;
    cVar1 = cio_linux_eventloop_add(loop,&evn->ev);
    if (cVar1 == CIO_SUCCESS) {
      cVar1 = cio_linux_eventloop_register_read((timer->impl).loop,&evn->ev);
      if (cVar1 == CIO_SUCCESS) {
        return CIO_SUCCESS;
      }
      cio_linux_eventloop_remove((timer->impl).loop,&evn->ev);
    }
    close(__fd);
  }
  return cVar1;
}

Assistant:

enum cio_error cio_timer_init(struct cio_timer *timer, struct cio_eventloop *loop,
                              cio_timer_close_hook_t close_hook)
{
	int fd = timerfd_create(CLOCK_MONOTONIC, O_NONBLOCK);
	if (cio_unlikely(fd == -1)) {
		return (enum cio_error)(-errno);
	}

	timer->close_hook = close_hook;
	timer->handler = NULL;
	timer->handler_context = NULL;
	timer->impl.loop = loop;

	timer->impl.ev.read_callback = timer_read;
	timer->impl.ev.write_callback = NULL;
	timer->impl.ev.fd = fd;

	enum cio_error ret_val = cio_linux_eventloop_add(timer->impl.loop, &timer->impl.ev);
	if (cio_unlikely(ret_val != CIO_SUCCESS)) {
		goto eventloop_add_failed;
	}

	ret_val = cio_linux_eventloop_register_read(timer->impl.loop, &timer->impl.ev);
	if (cio_unlikely(ret_val != CIO_SUCCESS)) {
		goto register_read_failed;
	}

	return ret_val;

register_read_failed:
	cio_linux_eventloop_remove(timer->impl.loop, &timer->impl.ev);
eventloop_add_failed:
	close(fd);
	return ret_val;
}